

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

string * __thiscall
ghc::filesystem::path::generic_u8string_abi_cxx11_(string *__return_storage_ptr__,path *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->_path)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE std::string path::generic_u8string() const
{
#ifdef GHC_OS_WINDOWS
    return generic_string<std::string::value_type, std::string::traits_type, std::string::allocator_type>();
#else
    return _path;
#endif
}